

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O1

bitmask<slang::ast::MethodFlags>
slang::ast::SubroutineSymbol::buildArguments
          (Scope *scope,Scope *parentScope,FunctionPortListSyntax *syntax,
          VariableLifetime defaultLifetime,
          SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *arguments)

{
  Scope *parentScope_00;
  WildcardImportData *pWVar1;
  SyntaxNode *this;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  SourceLocation SVar3;
  SourceLocation loc;
  ImplicitTypeSyntax *pIVar4;
  ulong uVar5;
  ArgumentDirection AVar6;
  long lVar7;
  bool bVar8;
  SourceRange SVar9;
  FormalArgumentSymbol *arg;
  ArgumentDirection direction;
  SourceLocation local_98;
  uint local_8c;
  uint local_88;
  ArgumentDirection local_84;
  Symbol *local_80;
  VariableLifetime local_74;
  FunctionPortListSyntax *local_70;
  Compilation *local_68;
  Scope *local_60;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *local_58;
  SubroutineSymbol *local_50;
  Token local_48;
  Scope *local_38;
  
  uVar5 = (syntax->ports).elements._M_extent._M_extent_value + 1;
  AVar6 = In;
  local_8c = 0;
  if (1 < uVar5) {
    local_68 = scope->compilation;
    uVar5 = uVar5 >> 1;
    lVar7 = 0;
    local_80 = (Symbol *)0x0;
    local_60 = (Scope *)0x0;
    local_8c = 0;
    local_88 = 0;
    local_74 = defaultLifetime;
    local_70 = syntax;
    local_58 = arguments;
    local_50 = (SubroutineSymbol *)scope;
    local_38 = parentScope;
    do {
      ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->ports).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar7));
      parentScope_00 = (Scope *)*ppSVar2;
      if ((SyntaxNode *)parentScope_00->nameMap != (SyntaxNode *)0x0) {
        Scope::addMembers(scope,(SyntaxNode *)parentScope_00->nameMap);
      }
      if (*(int *)&parentScope_00->compilation == 0x82) {
        if (local_60 == (Scope *)0x0) {
          inheritDefaultedArgList
                    ((SubroutineSymbol *)scope,local_38,parentScope_00,(SyntaxNode *)local_58,
                     arguments);
          local_8c = local_8c | 0x1000;
          local_60 = parentScope_00;
        }
        else {
          SVar9 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)parentScope_00);
          Scope::addDiag(scope,(DiagCode)0x830006,SVar9);
        }
        local_80 = (Symbol *)0x0;
        AVar6 = In;
      }
      else {
        pWVar1 = parentScope_00[1].importData;
        local_84 = AVar6;
        if (pWVar1 != (WildcardImportData *)0x0) {
          local_84 = SemanticFacts::getDirection((TokenKind)parentScope_00[1].deferredMemberIndex);
          if (local_84 == Ref) {
            if (local_74 == Static) {
              SVar9 = parsing::Token::range((Token *)&parentScope_00[1].deferredMemberIndex);
              Scope::addDiag(scope,(DiagCode)0xbb0006,SVar9);
            }
            bVar8 = parentScope_00[1].lastMember != (Symbol *)0x0;
            local_88 = bVar8 + 0x20;
            if (parentScope_00[2].thisSym == (Symbol *)0x0) {
              local_88 = (uint)bVar8;
            }
          }
          else {
            local_88 = 0;
          }
        }
        this = *(SyntaxNode **)&parentScope_00[2].deferredMemberIndex;
        local_48 = (Token)parsing::Token::valueText((Token *)(this + 1));
        local_98 = parsing::Token::location((Token *)(this + 1));
        SVar3 = (SourceLocation)
                BumpAllocator::
                emplace<slang::ast::FormalArgumentSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&,slang::ast::VariableLifetime&>
                          (&local_68->super_BumpAllocator,
                           (basic_string_view<char,_std::char_traits<char>_> *)&local_48,&local_98,
                           &local_84,&local_74);
        ((bitmask<slang::ast::VariableFlags> *)((long)SVar3 + 0x154))->m_bits =
             ((bitmask<slang::ast::VariableFlags> *)((long)SVar3 + 0x154))->m_bits |
             (ushort)local_88;
        local_98 = SVar3;
        if (parentScope_00[2].lastMember == (Symbol *)0x0) {
          if ((pWVar1 == (WildcardImportData *)0x0) && (local_80 != (Symbol *)0x0)) {
            ((anon_union_8_2_f12d5f64_for_typeOrLink *)((long)SVar3 + 0x50))->typeSyntax =
                 (DataTypeSyntax *)local_80;
            *(byte *)((long)SVar3 + 0x7f) = *(byte *)((long)SVar3 + 0x7f) & 0x7f;
          }
          else {
            local_48 = slang::syntax::SyntaxNode::getFirstToken(this);
            loc = parsing::Token::location(&local_48);
            pIVar4 = Compilation::createEmptyTypeSyntax(local_68,loc);
            ((anon_union_8_2_f12d5f64_for_typeOrLink *)((long)SVar3 + 0x50))->typeSyntax =
                 &pIVar4->super_DataTypeSyntax;
            *(byte *)((long)SVar3 + 0x7f) = *(byte *)((long)SVar3 + 0x7f) & 0x7f;
            local_80 = (Symbol *)0x0;
          }
        }
        else {
          ((anon_union_8_2_f12d5f64_for_typeOrLink *)((long)SVar3 + 0x50))->typeSyntax =
               (DataTypeSyntax *)parentScope_00[2].lastMember;
          *(byte *)((long)SVar3 + 0x7f) = *(byte *)((long)SVar3 + 0x7f) & 0x7f;
          local_80 = parentScope_00[2].lastMember;
        }
        syntax = local_70;
        syntax_00._M_ptr = (pointer)parentScope_00[1].thisSym;
        syntax_00._M_extent._M_extent_value = (size_t)parentScope_00[1].nameMap;
        Symbol::setAttributes((Symbol *)local_98,(Scope *)local_50,syntax_00);
        *(SyntaxNode **)((long)local_98 + 0x38) = this;
        if (this[3].previewNode != (SyntaxNode *)0x0) {
          DeclaredType::setDimensionSyntax
                    ((DeclaredType *)((long)local_98 + 0x40),
                     (SyntaxList<slang::syntax::VariableDimensionSyntax> *)&this[1].previewNode);
        }
        scope = (Scope *)local_50;
        if (*(long *)(this + 4) != 0) {
          *(ExpressionSyntax **)((long)local_98 + 0x168) =
               *(ExpressionSyntax **)(*(long *)(this + 4) + 0x28);
          *(Expression **)((long)local_98 + 0x170) = (Expression *)0x0;
        }
        arguments = (SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)0x1;
        Scope::insertMember((Scope *)local_50,(Symbol *)local_98,
                            (Symbol *)(local_50->super_Symbol).parentScope,false,true);
        SmallVectorBase<slang::ast::FormalArgumentSymbol_const*>::
        emplace_back<slang::ast::FormalArgumentSymbol_const*const&>
                  ((SmallVectorBase<slang::ast::FormalArgumentSymbol_const*> *)local_58,
                   (FormalArgumentSymbol **)&local_98);
        AVar6 = local_84;
      }
      lVar7 = lVar7 + 0x30;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return (bitmask<slang::ast::MethodFlags>)(underlying_type)local_8c;
}

Assistant:

bitmask<MethodFlags> SubroutineSymbol::buildArguments(
    Scope& scope, const Scope& parentScope, const FunctionPortListSyntax& syntax,
    VariableLifetime defaultLifetime, SmallVectorBase<const FormalArgumentSymbol*>& arguments) {

    auto& comp = scope.getCompilation();
    const DataTypeSyntax* lastType = nullptr;
    const SyntaxNode* explicitDefault = nullptr;
    auto lastDirection = ArgumentDirection::In;
    bitmask<VariableFlags> lastFlags;
    bitmask<MethodFlags> resultFlags;

    for (auto portBase : syntax.ports) {
        if (portBase->previewNode)
            scope.addMembers(*portBase->previewNode);

        if (portBase->kind == SyntaxKind::DefaultFunctionPort) {
            lastDirection = ArgumentDirection::In;
            lastType = nullptr;

            if (explicitDefault) {
                // Ignore a duplicate default.
                scope.addDiag(diag::MultipleDefaultConstructorArg, portBase->sourceRange());
            }
            else {
                explicitDefault = portBase;
                inheritDefaultedArgList(scope, parentScope, *portBase, arguments);
                resultFlags |= MethodFlags::DefaultedSuperArg;
            }
            continue;
        }

        auto direction = lastDirection;
        auto flags = lastFlags;
        bool directionSpecified = false;
        auto& fps = portBase->as<FunctionPortSyntax>();
        if (fps.direction) {
            directionSpecified = true;
            direction = SemanticFacts::getDirection(fps.direction.kind);
            flags = {};

            if (direction == ArgumentDirection::Ref) {
                if (defaultLifetime == VariableLifetime::Static)
                    scope.addDiag(diag::RefArgAutomaticFunc, fps.direction.range());

                if (fps.constKeyword)
                    flags |= VariableFlags::Const;

                if (fps.staticKeyword)
                    flags |= VariableFlags::RefStatic;
            }
        }

        auto& decl = *fps.declarator;
        auto arg = comp.emplace<FormalArgumentSymbol>(decl.name.valueText(), decl.name.location(),
                                                      direction, defaultLifetime);
        arg->flags |= flags;

        // If we're given a type, use that. Otherwise, if we were given a
        // direction, default to logic. Otherwise, use the last type.
        if (fps.dataType) {
            arg->setDeclaredType(*fps.dataType);
            lastType = fps.dataType;
        }
        else if (directionSpecified || !lastType) {
            arg->setDeclaredType(comp.createEmptyTypeSyntax(decl.getFirstToken().location()));
            lastType = nullptr;
        }
        else {
            arg->setDeclaredType(*lastType);
        }

        arg->setAttributes(scope, fps.attributes);
        arg->setSyntax(decl);

        if (!decl.dimensions.empty())
            arg->getDeclaredType()->setDimensionSyntax(decl.dimensions);

        if (decl.initializer)
            arg->setDefaultValueSyntax(*decl.initializer->expr);

        scope.addMember(*arg);
        arguments.push_back(arg);

        lastDirection = direction;
        lastFlags = flags;
    }

    return resultFlags;
}